

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint op_00;
  uint a_00;
  uint b_00;
  int iVar1;
  size_t sVar2;
  uint local_40;
  uint local_3c;
  uint next;
  uint pc;
  double counter;
  uint local_28;
  int length;
  int c;
  int b;
  int a;
  int op;
  char **argv_local;
  int argc_local;
  
  _next = 0.0;
  local_3c = 0;
  Tps = (timeval *)malloc(0x10);
  Tpf = (timeval *)malloc(0x10);
  Tzp = (void *)0x0;
  if ((1 < argc) && (argc < 4)) {
    if (argc == 2) {
      counter._4_4_ = 0;
      local_28 = 0;
    }
    else {
      sVar2 = strlen(argv[2]);
      counter._4_4_ = (int)sVar2 + 1;
      local_28 = alloc(counter._4_4_);
      copyParToMem(argv[2],local_28,(int)sVar2);
    }
    R[1] = argc + -1;
    R[2] = 0;
    R[3] = counter._4_4_;
    R[4] = local_28;
    load(argv[1]);
    gettimeofday((timeval *)Tps,(__timezone_ptr_t)Tzp);
    do {
      _next = _next + 1.0;
      local_40 = local_3c + 1;
      op_00 = C[local_3c] >> 0x1a;
      a_00 = C[local_3c] >> 0x15 & 0x1f;
      b_00 = C[local_3c] >> 0x10 & 0x1f;
      local_28 = C[local_3c] & 0xffff;
      if (op_00 < 0x10) {
        local_28 = R[(int)((ulong)(long)(int)local_28 % 0x20)];
      }
      else if (0x7fff < local_28) {
        local_28 = local_28 - 0x10000;
      }
      R[0] = 0;
      switch(op_00) {
      case 0:
      case 0x10:
        R[(int)a_00] = R[(int)b_00] + local_28;
        break;
      case 1:
      case 5:
      case 0x11:
      case 0x15:
        R[(int)a_00] = R[(int)b_00] - local_28;
        break;
      case 2:
      case 0x12:
        R[(int)a_00] = R[(int)b_00] * local_28;
        break;
      case 3:
      case 0x13:
        R[(int)a_00] = R[(int)b_00] / (int)local_28;
        break;
      case 4:
      case 0x14:
        R[(int)a_00] = R[(int)b_00] % (int)local_28;
        break;
      case 8:
      case 0x18:
        R[(int)a_00] = R[(int)b_00] | local_28;
        break;
      case 9:
      case 0x19:
        R[(int)a_00] = R[(int)b_00] & local_28;
        break;
      case 10:
      case 0x1a:
        R[(int)a_00] = R[(int)b_00] & (local_28 ^ 0xffffffff);
        break;
      case 0xb:
      case 0x1b:
        R[(int)a_00] = R[(int)b_00] ^ local_28;
        break;
      case 0xc:
      case 0x1c:
        R[(int)a_00] = R[(int)b_00] << ((byte)local_28 & 0x1f);
        break;
      case 0xe:
      case 0x1e:
        check(op_00,a_00,b_00,local_28,local_3c);
        break;
      case 0x20:
        R[(int)a_00] = M[(int)(R[(int)b_00] + local_28) / 4];
        break;
      case 0x22:
        R[(int)a_00] = M[R[(int)b_00] / 4];
        R[(int)b_00] = R[(int)b_00] + local_28;
        break;
      case 0x24:
        M[(int)(R[(int)b_00] + local_28) / 4] = R[(int)a_00];
        break;
      case 0x26:
        R[(int)b_00] = R[(int)b_00] - local_28;
        M[R[(int)b_00] / 4] = R[(int)a_00];
        break;
      case 0x28:
        if (R[(int)a_00] == 0) {
          local_40 = local_3c + local_28;
        }
        break;
      case 0x29:
        if (R[(int)a_00] != 0) {
          local_40 = local_3c + local_28;
        }
        break;
      case 0x2a:
        if (R[(int)a_00] < 0) {
          local_40 = local_3c + local_28;
        }
        break;
      case 0x2b:
        if (-1 < R[(int)a_00]) {
          local_40 = local_3c + local_28;
        }
        break;
      case 0x2c:
        if (R[(int)a_00] < 1) {
          local_40 = local_3c + local_28;
        }
        break;
      case 0x2d:
        if (0 < R[(int)a_00]) {
          local_40 = local_3c + local_28;
        }
        break;
      case 0x2e:
        local_40 = local_3c + local_28;
        R[0x1f] = (local_3c + 1) * 4;
        break;
      case 0x31:
        local_40 = R[(int)local_28 % 0x20] / 4;
        if (local_40 == 6) {
          gettimeofday((timeval *)Tpf,(__timezone_ptr_t)Tzp);
          fprintf(_stderr,"Total VM execution time (usec): %ld\n",
                  ((Tpf->tv_sec - Tps->tv_sec) * 1000000 + Tpf->tv_usec) - Tps->tv_usec);
          fprintf(_stderr,"Executed instructions per second: %e\n",
                  _next / (double)(Tpf->tv_sec - Tps->tv_sec));
          return 0;
        }
        break;
      case 0x32:
        iVar1 = alloc((int)local_28 / 4);
        R[(int)a_00] = iVar1;
        break;
      case 0x33:
        R[(int)a_00] = H[(int)(R[(int)b_00] + local_28) / 4];
        break;
      case 0x34:
        H[(int)(R[(int)b_00] + local_28) / 4] = R[(int)a_00];
        break;
      case 0x35:
        R[(int)a_00] = R[(int)local_28];
        break;
      case 0x37:
        printf("%c");
        break;
      case 0x38:
        printf("%d");
        break;
      case 0x39:
        iVar1 = getFD((int)(R[(int)b_00] + local_28) / 4,1);
        R[(int)a_00] = iVar1;
        break;
      case 0x3a:
        iVar1 = getFD((int)(R[(int)b_00] + local_28) / 4,0);
        R[(int)a_00] = iVar1;
        break;
      case 0x3b:
        fclose((FILE *)fds[R[(int)local_28]]);
        R[(int)a_00] = 1;
        break;
      case 0x3c:
        iVar1 = feof((FILE *)fds[R[(int)local_28]]);
        if (iVar1 == 0) {
          R[(int)a_00] = 0;
        }
        else {
          R[(int)a_00] = 1;
        }
        break;
      case 0x3d:
        iVar1 = fgetc((FILE *)fds[R[(int)local_28]]);
        R[(int)a_00] = iVar1;
        break;
      case 0x3e:
        fprintf(_stderr,"implicit exit with code %d\n",(ulong)(uint)R[(int)local_28]);
        getchar();
        exit(-1);
      }
      local_3c = local_40;
    } while( true );
  }
  fprintf(_stderr,"usage: ./vm <vminput> <arg>\n");
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {
	int op = 0;
	int a = 0;
	int b = 0;
	int c = 0;
	int length = 0;
	double counter = 0;
	unsigned int pc = 0; 
	unsigned int next = 0;
	Tps = (struct timeval *) malloc(sizeof(struct timeval));
	Tpf = (struct timeval *) malloc(sizeof(struct timeval));
	Tzp = 0;


	if ((argc < 2) || (argc > 3)) {
		fprintf(stderr,"usage: ./vm <vminput> <arg>\n");
		exit(-1);
	}
	
	if (argc == 2) {
		length = 0;
		c = 0;
	} else {
		length = strlen(argv[2])+1;
		c = alloc(length);
		copyParToMem(argv[2],c,length-1);

	}
	R[1] = argc - 1; // argc
	R[2] = 0; // isOnStack
	R[3] = length; // arglength
	R[4] = c; // adr

	load(argv[1]);
	gettimeofday (Tps, Tzp);
	while (1) {
		counter = counter + 1;
		next = pc + 1;
		op = C[pc] / 0x4000000 % 0x40;
		a = C[pc] / 0x200000 % 0x20;
		b = C[pc] / 0x10000 % 0x20;
		c = C[pc] % 0x10000;
		if (op < ADDI) { 
			c = R[c % 0x20]; 
		} else if (c >= 0x8000) { 
			c = c - 0x10000; 
		}
		R[0] = 0;
		
		switch (op) {
			case ADD: case ADDI: 
				R[a] = R[b] + c; 
				break;
			case MUL: case MULI: 
				R[a] = R[b] * c; 
				break;
			case SUBI: case SUB: case CMP: case CMPI: 
				R[a] = R[b] - c; 
				break;
			case BSR: 
				next = pc + c;
				R[31] = (pc + 1) * 4;
				break;
			case PSH: 
				R[b] = R[b] - c;
				M[R[b]/4] = R[a];
				break;
			case POP: 
				R[a] = M[R[b] / 4]; 
				R[b]=R[b]+c; 
				break;
			case STW: 
				M[(R[b] + c) / 4] = R[a];	
				break;
			case LDW: 
				R[a] = M[(R[b] + c) / 4]; 
				break;
			case DIV: case DIVI: 
				R[a] = R[b] / c; 
				break;
			case MOD: case MODI: 
				R[a] = R[b] % c; 
				break;
			case OR:  case ORI:  
				R[a] = R[b] | c; 
				break;
			case AND: case ANDI: 
				R[a] = R[b] & c; 
				break;
			case BIC: case BICI: 
				R[a] = R[b] & (~c); 
				break;
			case XOR: case XORI: 
				R[a] = R[b] ^ c; 
				break;
			case LSH: case LSHI: 
				R[a]=R[b] << c; 
				break;
			case BEQ: 
				if (R[a] == 0) { 
					next = pc + c; 
				} 
				break;
			case BNE: 
				if (R[a] != 0) { 
					next = pc + c; 
				} 
				break;
			case BLT: 
				if (R[a] < 0) { 
					next = pc + c; 
				} 
				break;
			case BGE: 
				if (R[a] >= 0) { 
					next = pc + c; 
				} 
				break;
			case BLE: 
				if (R[a] <= 0) { 
					next = pc + c; 
				} 
				break;
			case BGT: 
				if (R[a] > 0) { 
					next = pc + c; 
				} 
				break;
			case ALL: 
				R[a] = alloc(c/4); 
				break;
			case HSTW: 
				H[(R[b] + c) / 4] = R[a]; 
				break;
			case HLDW: 
				R[a] = H[(R[b] + c) / 4]; 
				break;
			case CHK: case CHKI: 
				check(op,a,b,c,pc); 
				break;
			case SFOPEN: 
				R[a] = getFD((R[b] + c) / 4,0); 
				break;
			case HFOPEN: 
				R[a] = getFD((R[b] + c) / 4,1); 
				break;
			case FCLOSE: 
				fclose(fds[R[c]]); 
				R[a] = 1;
				break;
			case FGETC: 
				R[a] = (int)fgetc(fds[R[c]]); 
				break;
			case FEOF: 
				if (feof(fds[R[c]]) != 0) { 
					R[a]=1;
				} else {
					R[a]=0;
				} 
				break;
			case WRI: 
				printf("%d",R[c]); 
				break;
			case WRC: 
				printf("%c",(char)R[c]); 
				break;
			case RET: 
				next = R[c % 32] / 4; 
				if (next == 6) {
					goto END;
				} 
				break;
			case HLT: 
				fprintf(stderr,"implicit exit with code %d\n", R[c]); 
				getchar();
				exit(-1);
				break;
			case ORD: 
				R[a] = (int)R[c]; 
				break;
		}
		pc = next;
	}
END:
	gettimeofday (Tpf, Tzp);
	fprintf(stderr,"Total VM execution time (usec): %ld\n",
              (Tpf->tv_sec-Tps->tv_sec)*1000000
             + Tpf->tv_usec-Tps->tv_usec);
	fprintf(stderr, "Executed instructions per second: %e\n", counter/(double)(Tpf->tv_sec-Tps->tv_sec));
	return 0;
}